

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

void mutex_owner_stats_update(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  
  puVar1 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
    (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(mutex->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  return;
}

Assistant:

static inline void
mutex_owner_stats_update(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	if (config_stats) {
		mutex_prof_data_t *data = &mutex->prof_data;
		data->n_lock_ops++;
		if (data->prev_owner != tsdn) {
			data->prev_owner = tsdn;
			data->n_owner_switches++;
		}
	}
}